

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mbedtls_rsa_rsassa_pkcs1_v15_verify
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  size_t sVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  mbedtls_md_info_t *md_info;
  ulong __n;
  uchar *puVar5;
  uchar *end;
  bool bVar6;
  mbedtls_asn1_buf oid;
  uchar buf [1024];
  uchar *local_468;
  ulong local_460;
  mbedtls_md_type_t local_454;
  mbedtls_asn1_buf local_450;
  uchar local_438 [1032];
  
  if ((mode != 1) || (iVar3 = -0x4080, ctx->padding == 0)) {
    sVar1 = ctx->len;
    iVar3 = -0x4080;
    if (0xfffffffffffffc0e < sVar1 - 0x401) {
      if (mode == 0) {
        iVar3 = mbedtls_rsa_public(ctx,sig,local_438);
      }
      else {
        iVar3 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,local_438);
      }
      if (((iVar3 == 0) && (iVar3 = -0x4100, local_438[0] == '\0')) &&
         (local_468 = local_438 + 2, local_438[1] == '\x01')) {
        if (local_438[2] != '\0') {
          puVar5 = local_468;
          do {
            local_468 = puVar5 + 1;
            if (local_438 + (sVar1 - 1) <= puVar5) {
              return -0x4100;
            }
            if (local_438[2] != 0xff) {
              return -0x4100;
            }
            local_438[2] = *local_468;
            puVar5 = local_468;
          } while (local_438[2] != '\0');
        }
        local_468 = local_468 + 1;
        puVar5 = local_438 + (sVar1 - (long)local_468);
        if ((md_alg == MBEDTLS_MD_NONE) && (puVar5 == (uchar *)(ulong)hashlen)) {
          iVar4 = bcmp(local_468,hash,(size_t)(ulong)hashlen);
          bVar6 = iVar4 == 0;
        }
        else {
          md_info = mbedtls_md_info_from_type(md_alg);
          if (md_info == (mbedtls_md_info_t *)0x0) {
            return -0x4080;
          }
          bVar2 = mbedtls_md_get_size(md_info);
          end = local_468 + (long)puVar5;
          iVar3 = mbedtls_asn1_get_tag(&local_468,end,&local_460,0x30);
          if (iVar3 != 0) {
            return -0x4380;
          }
          if ((uchar *)(local_460 + 2) != puVar5) {
            return -0x4380;
          }
          iVar3 = mbedtls_asn1_get_tag(&local_468,end,&local_460,0x30);
          if (iVar3 != 0) {
            return -0x4380;
          }
          __n = (ulong)bVar2;
          if ((uchar *)(local_460 + __n + 6) != puVar5) {
            return -0x4380;
          }
          iVar3 = mbedtls_asn1_get_tag(&local_468,end,&local_450.len,6);
          if (iVar3 != 0) {
            return -0x4380;
          }
          local_450.p = local_468;
          local_468 = local_468 + local_450.len;
          iVar3 = mbedtls_oid_get_md_alg(&local_450,&local_454);
          if (iVar3 != 0) {
            return -0x4380;
          }
          if (local_454 != md_alg) {
            return -0x4380;
          }
          iVar3 = mbedtls_asn1_get_tag(&local_468,end,&local_460,5);
          if (iVar3 != 0) {
            return -0x4380;
          }
          iVar3 = mbedtls_asn1_get_tag(&local_468,end,&local_460,4);
          puVar5 = local_468;
          if (iVar3 != 0) {
            return -0x4380;
          }
          if (local_460 != __n) {
            return -0x4380;
          }
          iVar3 = bcmp(local_468,hash,__n);
          if (iVar3 != 0) {
            return -0x4380;
          }
          iVar4 = 0;
          bVar6 = puVar5 + __n == end;
        }
        iVar3 = -0x4380;
        if (bVar6) {
          iVar3 = iVar4;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_rsassa_pkcs1_v15_verify( mbedtls_rsa_context *ctx,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng,
                                 int mode,
                                 mbedtls_md_type_t md_alg,
                                 unsigned int hashlen,
                                 const unsigned char *hash,
                                 const unsigned char *sig )
{
    int ret;
    size_t len, siglen, asn1_len;
    unsigned char *p, *end;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    mbedtls_md_type_t msg_md_alg;
    const mbedtls_md_info_t *md_info;
    mbedtls_asn1_buf oid;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    siglen = ctx->len;

    if( siglen < 16 || siglen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, buf );

    if( ret != 0 )
        return( ret );

    p = buf;

    if( *p++ != 0 || *p++ != MBEDTLS_RSA_SIGN )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    while( *p != 0 )
    {
        if( p >= buf + siglen - 1 || *p != 0xFF )
            return( MBEDTLS_ERR_RSA_INVALID_PADDING );
        p++;
    }
    p++;

    len = siglen - ( p - buf );

    if( len == hashlen && md_alg == MBEDTLS_MD_NONE )
    {
        if( memcmp( p, hash, hashlen ) == 0 )
            return( 0 );
        else
            return( MBEDTLS_ERR_RSA_VERIFY_FAILED );
    }

    md_info = mbedtls_md_info_from_type( md_alg );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    hashlen = mbedtls_md_get_size( md_info );

    end = p + len;

    // Parse the ASN.1 structure inside the PKCS#1 v1.5 structure
    //
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &asn1_len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( asn1_len + 2 != len )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &asn1_len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( asn1_len + 6 + hashlen != len )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &oid.len, MBEDTLS_ASN1_OID ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    oid.p = p;
    p += oid.len;

    if( mbedtls_oid_get_md_alg( &oid, &msg_md_alg ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( md_alg != msg_md_alg )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    /*
     * assume the algorithm parameters must be NULL
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &asn1_len, MBEDTLS_ASN1_NULL ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &asn1_len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( asn1_len != hashlen )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( memcmp( p, hash, hashlen ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    p += hashlen;

    if( p != end )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    return( 0 );
}